

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFEFStreamObjectHelper.cc
# Opt level: O1

string * __thiscall
QPDFEFStreamObjectHelper::getCreationDate_abi_cxx11_
          (string *__return_storage_ptr__,QPDFEFStreamObjectHelper *this)

{
  bool bVar1;
  QPDFObjectHandle val;
  QPDFObjectHandle QStack_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> local_28;
  
  local_38._M_pi = &local_28;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"/CreationDate","");
  getParam((QPDFEFStreamObjectHelper *)&QStack_48,(string *)this);
  if (local_38._M_pi != &local_28) {
    operator_delete(local_38._M_pi,(ulong)((long)(_func_int ***)local_28._vptr__Sp_counted_base + 1)
                   );
  }
  bVar1 = QPDFObjectHandle::isString(&QStack_48);
  if (bVar1) {
    QPDFObjectHandle::getUTF8Value_abi_cxx11_(__return_storage_ptr__,&QStack_48);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  if ((element_type *)
      QStack_48.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (QStack_48.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
QPDFEFStreamObjectHelper::getCreationDate()
{
    auto val = getParam("/CreationDate");
    if (val.isString()) {
        return val.getUTF8Value();
    }
    return "";
}